

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::vertexAttribIPointer
          (ReferenceContext *this,deUint32 index,int size,deUint32 type,int stride,void *pointer)

{
  int *piVar1;
  VertexArray *pVVar2;
  pointer pVVar3;
  VertexArray *pVVar4;
  
  if ((index < (uint)(this->m_limits).maxVertexAttribs) && (0xfffffffb < size - 5U)) {
    if (type - 0x1406 < 0xfffffffa) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    if (-1 < stride) {
      pVVar2 = this->m_vertexArrayBinding;
      if (((pVVar2 != (VertexArray *)0x0) && (pointer != (void *)0x0)) &&
         (this->m_arrayBufferBinding == (DataBuffer *)0x0)) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x502;
        return;
      }
      pVVar4 = &this->m_clientVertexArray;
      if (pVVar2 != (VertexArray *)0x0) {
        pVVar4 = pVVar2;
      }
      pVVar3 = (pVVar4->m_arrays).
               super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar3[index].size = size;
      pVVar3[index].stride = stride;
      pVVar3[index].type = type;
      pVVar3[index].normalized = false;
      pVVar3[index].integer = true;
      pVVar3[index].pointer = pointer;
      if (this->m_arrayBufferBinding != (DataBuffer *)0x0) {
        piVar1 = &(this->m_arrayBufferBinding->super_NamedObject).m_refCount;
        *piVar1 = *piVar1 + 1;
      }
      if (pVVar3[index].bufferBinding != (DataBuffer *)0x0) {
        rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
                  (&this->m_buffers,pVVar3[index].bufferBinding);
      }
      pVVar3 = (pVVar4->m_arrays).
               super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar3[index].bufferDeleted = false;
      pVVar3[index].bufferBinding = this->m_arrayBufferBinding;
      return;
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::vertexAttribIPointer (deUint32 index, int size, deUint32 type, int stride, const void *pointer)
{
	RC_IF_ERROR(index >= (deUint32)m_limits.maxVertexAttribs, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(size <= 0 || size > 4, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(type != GL_BYTE					&&	type != GL_UNSIGNED_BYTE	&&
				type != GL_SHORT				&&	type != GL_UNSIGNED_SHORT	&&
				type != GL_INT					&&	type != GL_UNSIGNED_INT, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(stride < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(m_vertexArrayBinding != DE_NULL && m_arrayBufferBinding == DE_NULL && pointer != DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);

	vao.m_arrays[index].size			= size;
	vao.m_arrays[index].stride			= stride;
	vao.m_arrays[index].type			= type;
	vao.m_arrays[index].normalized		= false;
	vao.m_arrays[index].integer			= true;
	vao.m_arrays[index].pointer			= pointer;

	// acquire new reference
	if (m_arrayBufferBinding)
		m_buffers.acquireReference(m_arrayBufferBinding);

	// release old reference
	if (vao.m_arrays[index].bufferBinding)
		m_buffers.releaseReference(vao.m_arrays[index].bufferBinding);

	vao.m_arrays[index].bufferDeleted	= false;
	vao.m_arrays[index].bufferBinding	= m_arrayBufferBinding;
}